

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

ON_BrepFace * __thiscall ON_Brep::NewFace(ON_Brep *this,int si)

{
  int iVar1;
  ON_BrepFace *pOVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  iVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  uVar3 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_capacity;
  lVar4 = (long)iVar1;
  uVar5 = (uint)(lVar4 + 1U);
  if (uVar3 < uVar5) {
    ON_ClassArray<ON_BrepFace>::SetCapacity((ON_ClassArray<ON_BrepFace> *)&this->m_F,lVar4 + 1U);
    uVar3 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
            m_capacity;
  }
  if ((-2 < iVar1) && (iVar1 < (int)uVar3)) {
    (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count = uVar5;
  }
  pOVar2 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
  pOVar2[lVar4].m_face_index = iVar1;
  pOVar2[lVar4].m_si = si;
  pOVar2[lVar4].m_brep = this;
  if ((-1 < si) && (si < (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count)) {
    ON_SurfaceProxy::SetProxySurface
              (&pOVar2[lVar4].super_ON_SurfaceProxy,
               (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[(uint)si]);
  }
  return pOVar2 + lVar4;
}

Assistant:

ON_BrepFace& ON_Brep::NewFace( int si )
{
  m_bbox.Destroy();
  // GBA 28-MAy-2020 RH-58462.  m_bbox is now left unset after this function
  // This works since ON_BrepFace::BoundingBox() supports lazy evaluation 
  m_is_solid = 0;
  int fi = m_F.Count();
  m_F.Reserve(fi+1);
  m_F.SetCount(fi+1);
  ON_BrepFace& face = m_F.Array()[fi];
  face.m_face_index = fi;
  face.m_si = si;
  face.m_brep = this;
  if ( si >= 0 && si < m_S.Count() )
    face.SetProxySurface(m_S[si]);
  
  return face;
}